

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
* __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::Clone
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  *pPVar1;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *in_RDI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *unaff_retaddr;
  
  pPVar1 = (ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
            *)operator_new(0x68);
  IteratorImpl(unaff_retaddr,in_RDI);
  return pPVar1;
}

Assistant:

ParamIteratorInterface<ParamType>* Clone() const override {
      return new IteratorImpl(*this);
    }